

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerFunctionEntry(Lowerer *this,Instr *funcEntry)

{
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  undefined4 *puVar4;
  JITTimeFunctionBody *pJVar5;
  Instr *insertBeforeInstr_00;
  Instr *this_00;
  HelperCallOpnd *newSrc;
  RegOpnd *opndArg;
  Opnd *dst;
  Opnd *src;
  Opnd *starFlag;
  Instr *callInstr;
  Instr *insertBeforeInstr;
  Instr *funcEntry_local;
  Lowerer *this_local;
  
  if (funcEntry->m_opcode != FunctionEntry) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6829,"(funcEntry->m_opcode == Js::OpCode::FunctionEntry)",
                       "funcEntry->m_opcode == Js::OpCode::FunctionEntry");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = Func::IsLoopBody(this->m_func);
  if (!bVar2) {
    pJVar5 = Func::GetJITFunctionBody(this->m_func);
    bVar2 = JITTimeFunctionBody::IsAsmJsMode(pJVar5);
    if (!bVar2) {
      insertBeforeInstr_00 = Func::GetFunctionEntryInsertionPoint(this->m_func);
      LowerFunctionBodyCallCountChange(this,insertBeforeInstr_00);
      bVar2 = Func::DoSimpleJitDynamicProfile(this->m_func);
      if (bVar2) {
        pJVar5 = Func::GetJITFunctionBody(this->m_func);
        AVar3 = JITTimeFunctionBody::GetInParamsCount(pJVar5);
        if (1 < AVar3) {
          pJVar5 = Func::GetJITFunctionBody(this->m_func);
          bVar2 = JITTimeFunctionBody::HasImplicitArgIns(pJVar5);
          if (bVar2) {
            this_00 = IR::Instr::New(Call,this->m_func);
            newSrc = IR::HelperCallOpnd::New(HelperSimpleProfileParameters,this->m_func);
            IR::Instr::SetSrc1(this_00,&newSrc->super_Opnd);
            IR::Instr::InsertBefore(insertBeforeInstr_00,this_00);
            opndArg = IR::Opnd::CreateFramePointerOpnd(this->m_func);
            LowererMD::LoadHelperArgument(&this->m_lowererMD,this_00,&opndArg->super_Opnd);
            LowererMD::LowerCall(&this->m_lowererMD,this_00,0);
          }
        }
        dst = GetImplicitCallFlagsOpnd(this);
        src = CreateClearImplicitCallFlagsOpnd(this);
        InsertMove(dst,src,insertBeforeInstr_00,true);
      }
    }
  }
  return;
}

Assistant:

void Lowerer::LowerFunctionEntry(IR::Instr* funcEntry)
{
    Assert(funcEntry->m_opcode == Js::OpCode::FunctionEntry);

    //Don't do a body call increment for loops or asm.js
    if (m_func->IsLoopBody() || m_func->GetJITFunctionBody()->IsAsmJsMode())
    {
        return;
    }

    IR::Instr *const insertBeforeInstr = this->m_func->GetFunctionEntryInsertionPoint();

    LowerFunctionBodyCallCountChange(insertBeforeInstr);

    if (m_func->DoSimpleJitDynamicProfile())
    {
        // Only generate the argument profiling if the function expects to have some arguments to profile and only if
        //    it has implicit ArgIns (the latter is a restriction imposed by the Interpreter, so it is mirrored in SimpleJit)

        if (m_func->GetJITFunctionBody()->GetInParamsCount() > 1 && m_func->GetJITFunctionBody()->HasImplicitArgIns())
        {
            // Call out to the argument profiling helper
            IR::Instr* callInstr = IR::Instr::New(Js::OpCode::Call, m_func);
            callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperSimpleProfileParameters, m_func));
            insertBeforeInstr->InsertBefore(callInstr);
            m_lowererMD.LoadHelperArgument(callInstr, IR::Opnd::CreateFramePointerOpnd(m_func));
            m_lowererMD.LowerCall(callInstr, 0);
        }

        // Clear existing ImplicitCallFlags
        const auto starFlag = GetImplicitCallFlagsOpnd();
        this->InsertMove(starFlag, CreateClearImplicitCallFlagsOpnd(), insertBeforeInstr);
    }
}